

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Blip_Buffer.cpp
# Opt level: O0

void __thiscall Blip_Buffer::bass_freq(Blip_Buffer *this,int freq)

{
  bool bVar1;
  long f;
  int shift;
  int freq_local;
  Blip_Buffer *this_local;
  
  this->bass_freq_ = freq;
  shift = 0x1f;
  if (0 < freq) {
    shift = 0xd;
    f = (long)(freq << 0x10) / this->sample_rate_;
    do {
      f = f >> 1;
      bVar1 = false;
      if (f != 0) {
        shift = shift + -1;
        bVar1 = shift != 0;
      }
    } while (bVar1);
  }
  this->bass_shift_ = shift;
  return;
}

Assistant:

void Blip_Buffer::bass_freq( int freq )
{
	bass_freq_ = freq;
	int shift = 31;
	if ( freq > 0 )
	{
		shift = 13;
		long f = (freq << 16) / sample_rate_;
		while ( (f >>= 1) && --shift ) { }
	}
	bass_shift_ = shift;
}